

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O0

void __thiscall DIS::SeesPdu::unmarshal(SeesPdu *this,DataStream *dataStream)

{
  undefined1 local_58 [8];
  VectoringNozzleSystem x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  PropulsionSystemData x;
  size_t idx;
  DataStream *dataStream_local;
  SeesPdu *this_local;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_orginatingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_infraredSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_acousticSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_radarCrossSectionSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_numberOfPropulsionSystems);
  DataStream::operator>>(dataStream,&this->_numberOfVectoringNozzleSystems);
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::clear
            (&this->_propulsionSystemData);
  x._powerSetting = 0.0;
  x._engineRpm = 0.0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfPropulsionSystems; x._8_8_ = x._8_8_ + 1) {
    PropulsionSystemData::PropulsionSystemData((PropulsionSystemData *)local_30);
    PropulsionSystemData::unmarshal((PropulsionSystemData *)local_30,dataStream);
    std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::push_back
              (&this->_propulsionSystemData,(value_type *)local_30);
    PropulsionSystemData::~PropulsionSystemData((PropulsionSystemData *)local_30);
  }
  std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::clear
            (&this->_vectoringSystemData);
  x_1._horizontalDeflectionAngle = 0.0;
  x_1._verticalDeflectionAngle = 0.0;
  for (; (ulong)x_1._8_8_ < (ulong)this->_numberOfVectoringNozzleSystems; x_1._8_8_ = x_1._8_8_ + 1)
  {
    VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)local_58);
    VectoringNozzleSystem::unmarshal((VectoringNozzleSystem *)local_58,dataStream);
    std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::push_back
              (&this->_vectoringSystemData,(value_type *)local_58);
    VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)local_58);
  }
  return;
}

Assistant:

void SeesPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _orginatingEntityID.unmarshal(dataStream);
    dataStream >> _infraredSignatureRepresentationIndex;
    dataStream >> _acousticSignatureRepresentationIndex;
    dataStream >> _radarCrossSectionSignatureRepresentationIndex;
    dataStream >> _numberOfPropulsionSystems;
    dataStream >> _numberOfVectoringNozzleSystems;

     _propulsionSystemData.clear();
     for(size_t idx = 0; idx < _numberOfPropulsionSystems; idx++)
     {
        PropulsionSystemData x;
        x.unmarshal(dataStream);
        _propulsionSystemData.push_back(x);
     }

     _vectoringSystemData.clear();
     for(size_t idx = 0; idx < _numberOfVectoringNozzleSystems; idx++)
     {
        VectoringNozzleSystem x;
        x.unmarshal(dataStream);
        _vectoringSystemData.push_back(x);
     }
}